

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

N_Vector N_VCloneEmpty_SensWrapper(N_Vector w)

{
  N_Vector_Ops __ptr;
  long *__ptr_00;
  void *pvVar1;
  long *in_RDI;
  N_VectorContent_SensWrapper content;
  N_Vector_Ops ops;
  N_Vector v;
  int i;
  int local_14;
  N_Vector local_8;
  
  if (in_RDI == (long *)0x0) {
    local_8 = (N_Vector)0x0;
  }
  else if (*(int *)(*in_RDI + 8) < 1) {
    local_8 = (N_Vector)0x0;
  }
  else {
    local_8 = (N_Vector)malloc(0x18);
    if (local_8 == (N_Vector)0x0) {
      local_8 = (N_Vector)0x0;
    }
    else {
      __ptr = (N_Vector_Ops)malloc(0x1c0);
      if (__ptr == (N_Vector_Ops)0x0) {
        free(local_8);
        local_8 = (N_Vector)0x0;
      }
      else {
        __ptr->nvgetvectorid = *(_func_N_Vector_ID_N_Vector **)in_RDI[1];
        __ptr->nvclone = *(_func_N_Vector_N_Vector **)(in_RDI[1] + 8);
        __ptr->nvcloneempty = *(_func_N_Vector_N_Vector **)(in_RDI[1] + 0x10);
        __ptr->nvdestroy = *(_func_void_N_Vector **)(in_RDI[1] + 0x18);
        __ptr->nvspace =
             *(_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr **)(in_RDI[1] + 0x20);
        __ptr->nvgetarraypointer = *(_func_sunrealtype_ptr_N_Vector **)(in_RDI[1] + 0x28);
        __ptr->nvsetarraypointer = *(_func_void_sunrealtype_ptr_N_Vector **)(in_RDI[1] + 0x38);
        __ptr->nvlinearsum =
             *(_func_void_sunrealtype_N_Vector_sunrealtype_N_Vector_N_Vector **)(in_RDI[1] + 0x58);
        __ptr->nvconst = *(_func_void_sunrealtype_N_Vector **)(in_RDI[1] + 0x60);
        __ptr->nvprod = *(_func_void_N_Vector_N_Vector_N_Vector **)(in_RDI[1] + 0x68);
        __ptr->nvdiv = *(_func_void_N_Vector_N_Vector_N_Vector **)(in_RDI[1] + 0x70);
        __ptr->nvscale = *(_func_void_sunrealtype_N_Vector_N_Vector **)(in_RDI[1] + 0x78);
        __ptr->nvabs = *(_func_void_N_Vector_N_Vector **)(in_RDI[1] + 0x80);
        __ptr->nvinv = *(_func_void_N_Vector_N_Vector **)(in_RDI[1] + 0x88);
        __ptr->nvaddconst = *(_func_void_N_Vector_sunrealtype_N_Vector **)(in_RDI[1] + 0x90);
        __ptr->nvdotprod = *(_func_sunrealtype_N_Vector_N_Vector **)(in_RDI[1] + 0x98);
        __ptr->nvmaxnorm = *(_func_sunrealtype_N_Vector **)(in_RDI[1] + 0xa0);
        __ptr->nvwrmsnormmask = *(_func_sunrealtype_N_Vector_N_Vector_N_Vector **)(in_RDI[1] + 0xb0)
        ;
        __ptr->nvwrmsnorm = *(_func_sunrealtype_N_Vector_N_Vector **)(in_RDI[1] + 0xa8);
        __ptr->nvmin = *(_func_sunrealtype_N_Vector **)(in_RDI[1] + 0xb8);
        __ptr->nvwl2norm = *(_func_sunrealtype_N_Vector_N_Vector **)(in_RDI[1] + 0xc0);
        __ptr->nvl1norm = *(_func_sunrealtype_N_Vector **)(in_RDI[1] + 200);
        __ptr->nvcompare = *(_func_void_sunrealtype_N_Vector_N_Vector **)(in_RDI[1] + 0xd0);
        __ptr->nvinvtest = *(_func_int_N_Vector_N_Vector **)(in_RDI[1] + 0xd8);
        __ptr->nvconstrmask = *(_func_int_N_Vector_N_Vector_N_Vector **)(in_RDI[1] + 0xe0);
        __ptr->nvminquotient = *(_func_sunrealtype_N_Vector_N_Vector **)(in_RDI[1] + 0xe8);
        __ptr->nvlinearcombination =
             *(_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_ptr_N_Vector **)(in_RDI[1] + 0xf0);
        __ptr->nvscaleaddmulti =
             *(_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_N_Vector_ptr_N_Vector_ptr **)
              (in_RDI[1] + 0xf8);
        __ptr->nvdotprodmulti =
             *(_func_SUNErrCode_int_N_Vector_N_Vector_ptr_sunrealtype_ptr **)(in_RDI[1] + 0x100);
        __ptr->nvlinearsumvectorarray =
             *(_func_SUNErrCode_int_sunrealtype_N_Vector_ptr_sunrealtype_N_Vector_ptr_N_Vector_ptr
               **)(in_RDI[1] + 0x108);
        __ptr->nvscalevectorarray =
             *(_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr **)(in_RDI[1] + 0x110)
        ;
        __ptr->nvconstvectorarray =
             *(_func_SUNErrCode_int_sunrealtype_N_Vector_ptr **)(in_RDI[1] + 0x118);
        __ptr->nvwrmsnormvectorarray =
             *(_func_SUNErrCode_int_N_Vector_ptr_N_Vector_ptr_sunrealtype_ptr **)(in_RDI[1] + 0x120)
        ;
        __ptr->nvwrmsnormmaskvectorarray =
             *(_func_SUNErrCode_int_N_Vector_ptr_N_Vector_ptr_N_Vector_sunrealtype_ptr **)
              (in_RDI[1] + 0x128);
        __ptr->nvscaleaddmultivectorarray =
             *(_func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr_ptr_N_Vector_ptr_ptr
               **)(in_RDI[1] + 0x130);
        __ptr->nvlinearcombinationvectorarray =
             *(_func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_ptr_N_Vector_ptr **)
              (in_RDI[1] + 0x138);
        __ptr_00 = (long *)malloc(0x10);
        if (__ptr_00 == (long *)0x0) {
          free(__ptr);
          free(local_8);
          local_8 = (N_Vector)0x0;
        }
        else {
          *(undefined4 *)(__ptr_00 + 1) = *(undefined4 *)(*in_RDI + 8);
          *(undefined4 *)((long)__ptr_00 + 0xc) = 0;
          *__ptr_00 = 0;
          pvVar1 = malloc((long)*(int *)(*in_RDI + 8) << 3);
          *__ptr_00 = (long)pvVar1;
          if (*__ptr_00 == 0) {
            free(__ptr);
            free(local_8);
            free(__ptr_00);
            local_8 = (N_Vector)0x0;
          }
          else {
            for (local_14 = 0; local_14 < *(int *)(*in_RDI + 8); local_14 = local_14 + 1) {
              *(undefined8 *)(*__ptr_00 + (long)local_14 * 8) = 0;
            }
            local_8->content = __ptr_00;
            local_8->ops = __ptr;
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

N_Vector N_VCloneEmpty_SensWrapper(N_Vector w)
{
  int i;
  N_Vector v;
  N_Vector_Ops ops;
  N_VectorContent_SensWrapper content;

  if (w == NULL) { return (NULL); }

  if (NV_NVECS_SW(w) < 1) { return (NULL); }

  /* create vector */
  v = NULL;
  v = (N_Vector)malloc(sizeof *v);
  if (v == NULL) { return (NULL); }

  /* create vector operation structure */
  ops = NULL;
  ops = (N_Vector_Ops)malloc(sizeof *ops);
  if (ops == NULL)
  {
    free(v);
    return (NULL);
  }

  ops->nvgetvectorid     = w->ops->nvgetvectorid;
  ops->nvclone           = w->ops->nvclone;
  ops->nvcloneempty      = w->ops->nvcloneempty;
  ops->nvdestroy         = w->ops->nvdestroy;
  ops->nvspace           = w->ops->nvspace;
  ops->nvgetarraypointer = w->ops->nvgetarraypointer;
  ops->nvsetarraypointer = w->ops->nvsetarraypointer;

  /* standard vector operations */
  ops->nvlinearsum    = w->ops->nvlinearsum;
  ops->nvconst        = w->ops->nvconst;
  ops->nvprod         = w->ops->nvprod;
  ops->nvdiv          = w->ops->nvdiv;
  ops->nvscale        = w->ops->nvscale;
  ops->nvabs          = w->ops->nvabs;
  ops->nvinv          = w->ops->nvinv;
  ops->nvaddconst     = w->ops->nvaddconst;
  ops->nvdotprod      = w->ops->nvdotprod;
  ops->nvmaxnorm      = w->ops->nvmaxnorm;
  ops->nvwrmsnormmask = w->ops->nvwrmsnormmask;
  ops->nvwrmsnorm     = w->ops->nvwrmsnorm;
  ops->nvmin          = w->ops->nvmin;
  ops->nvwl2norm      = w->ops->nvwl2norm;
  ops->nvl1norm       = w->ops->nvl1norm;
  ops->nvcompare      = w->ops->nvcompare;
  ops->nvinvtest      = w->ops->nvinvtest;
  ops->nvconstrmask   = w->ops->nvconstrmask;
  ops->nvminquotient  = w->ops->nvminquotient;

  /* fused vector operations */
  ops->nvlinearcombination = w->ops->nvlinearcombination;
  ops->nvscaleaddmulti     = w->ops->nvscaleaddmulti;
  ops->nvdotprodmulti      = w->ops->nvdotprodmulti;

  /* vector array operations */
  ops->nvlinearsumvectorarray         = w->ops->nvlinearsumvectorarray;
  ops->nvscalevectorarray             = w->ops->nvscalevectorarray;
  ops->nvconstvectorarray             = w->ops->nvconstvectorarray;
  ops->nvwrmsnormvectorarray          = w->ops->nvwrmsnormvectorarray;
  ops->nvwrmsnormmaskvectorarray      = w->ops->nvwrmsnormmaskvectorarray;
  ops->nvscaleaddmultivectorarray     = w->ops->nvscaleaddmultivectorarray;
  ops->nvlinearcombinationvectorarray = w->ops->nvlinearcombinationvectorarray;

  /* Create content */
  content = NULL;
  content = (N_VectorContent_SensWrapper)malloc(sizeof *content);
  if (content == NULL)
  {
    free(ops);
    free(v);
    return (NULL);
  }

  content->nvecs    = NV_NVECS_SW(w);
  content->own_vecs = SUNFALSE;
  content->vecs     = NULL;
  content->vecs     = (N_Vector*)malloc(NV_NVECS_SW(w) * sizeof(N_Vector));
  if (content->vecs == NULL)
  {
    free(ops);
    free(v);
    free(content);
    return (NULL);
  }

  /* initialize vector array to null */
  for (i = 0; i < NV_NVECS_SW(w); i++) { content->vecs[i] = NULL; }

  /* Attach content and ops */
  v->content = content;
  v->ops     = ops;

  return (v);
}